

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O3

void sys_fakefromgui(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  t_symbol *s;
  t_atom zz [38];
  char buf [1000];
  t_atom local_648;
  undefined4 local_638;
  undefined4 local_630;
  float afStack_628 [144];
  char local_3e8 [1000];
  
  s = (t_symbol *)0x3e8;
  pcVar2 = getcwd(local_3e8,1000);
  if (pcVar2 == (char *)0x0) {
    local_3e8[0] = '.';
    local_3e8[1] = '\0';
  }
  local_648.a_type = A_SYMBOL;
  pcVar2 = local_3e8;
  local_648.a_w.w_symbol = gensym(pcVar2);
  local_638 = 1;
  local_630 = 0;
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)defaultfontshit + lVar3);
    afStack_628[lVar3] = 1.4013e-45;
    afStack_628[lVar3 + 2] = (float)iVar1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x90);
  glob_initfromgui(pcVar2,s,0x26,&local_648);
  clock_free(sys_fakefromguiclk);
  return;
}

Assistant:

static void sys_fakefromgui(void)
{
        /* fake the GUI's message giving cwd and font sizes in case
        we aren't starting the gui. */
    t_atom zz[NDEFAULTFONT+2];
    int i;
    char buf[MAXPDSTRING];
#ifdef _WIN32
    if (GetCurrentDirectory(MAXPDSTRING, buf) == 0)
        strcpy(buf, ".");
#else
    if (!getcwd(buf, MAXPDSTRING))
        strcpy(buf, ".");
#endif
    SETSYMBOL(zz, gensym(buf));
    SETFLOAT(zz+1, 0);
    for (i = 0; i < (int)NDEFAULTFONT; i++)
        SETFLOAT(zz+i+2, defaultfontshit[i]);
    glob_initfromgui(0, 0, 2+NDEFAULTFONT, zz);
    clock_free(sys_fakefromguiclk);
}